

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

void __thiscall MPL::detail::ModelPackageImpl::~ModelPackageImpl(ModelPackageImpl *this)

{
  path *__p;
  ModelPackageImpl *this_00;
  path uniquedDestination;
  path suffix;
  error_code ecode;
  ofstream uniquedStream;
  byte abStack_1f8 [480];
  
  if (this->m_readOnly == false) {
    __p = &this->m_manifestPath;
    this_00 = (ModelPackageImpl *)__p;
    std::filesystem::__cxx11::path::path(&uniquedDestination,__p);
    generateIdentifier_abi_cxx11_((string *)&uniquedStream,this_00);
    std::filesystem::__cxx11::path::path(&suffix,(string_type *)&uniquedStream,auto_format);
    std::__cxx11::string::~string((string *)&uniquedStream);
    std::filesystem::__cxx11::path::replace_extension(&uniquedDestination);
    std::ofstream::ofstream(&uniquedStream,uniquedDestination._M_pathname._M_dataplus._M_p,_S_bin);
    JsonMap::serialize((this->m_manifest)._M_t.
                       super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>._M_t.
                       super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
                       super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl,
                       (ostream *)&uniquedStream);
    std::ofstream::close();
    if ((abStack_1f8[*(long *)(_uniquedStream + -0x18)] & 5) == 0) {
      ecode._M_value = 0;
      ecode._M_cat = (error_category *)std::_V2::system_category();
      std::filesystem::rename(&uniquedDestination,__p,&ecode);
      if (ecode._M_value != 0) {
        std::filesystem::remove(&uniquedDestination);
      }
    }
    std::ofstream::~ofstream(&uniquedStream);
    std::filesystem::__cxx11::path::~path(&suffix);
    std::filesystem::__cxx11::path::~path(&uniquedDestination);
  }
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr(&this->m_manifest);
  std::filesystem::__cxx11::path::~path(&this->m_packageDataDirPath);
  std::filesystem::__cxx11::path::~path(&this->m_manifestPath);
  std::filesystem::__cxx11::path::~path(&this->m_packagePath);
  return;
}

Assistant:

ModelPackageImpl::~ModelPackageImpl()
{
    if (m_readOnly) {
        return;
    }
    
    std::filesystem::path uniquedDestination(m_manifestPath);
    std::filesystem::path suffix(generateIdentifier()); // std::filesystem::path from stringified UUID
    uniquedDestination.replace_extension(suffix); // unique filename in the presumed writable directory where Manifest.json is sited
    
    std::ofstream uniquedStream(uniquedDestination, std::ios::binary);
    m_manifest->serialize(uniquedStream);
    uniquedStream.close();
    if (uniquedStream.fail()) { // If any of the above fail do not go on to move uniquedDestination to m_manifestPath.
        return;
    }
    
    std::error_code ecode;
    std::filesystem::rename(uniquedDestination, m_manifestPath, ecode); // On failure sets ecode and makes no changes. Does not throw.
    if (ecode.value()) {
        std::filesystem::remove(uniquedDestination);
    }
}